

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

S2CellId S2CellId::FromFaceIJ(int face,int i,int j)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  anon_class_8_1_ba1d2be6 __callable;
  undefined1 local_31;
  undefined1 *local_30;
  
  local_30 = &local_31;
  plVar2 = (long *)__tls_get_addr(&PTR_002bdd28);
  *plVar2 = (long)&local_30;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_002bdb50);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&flag._M_once,__once_proxy);
  if (iVar1 == 0) {
    *plVar2 = 0;
    *puVar3 = 0;
    return (S2CellId)
           (((ulong)(lookup_pos
                     [(i & 0xfU) * 0x40 + (j & 0xfU) * 4 |
                      lookup_pos
                      [((uint)j >> 2 & 0x3c) + (i & 0xf0U) * 4 |
                       lookup_pos
                       [(uint)j >> 6 & 0x3c | (uint)i >> 2 & 0x3c0 |
                        lookup_pos
                        [(uint)j >> 10 & 0x3c | (uint)i >> 6 & 0x3c0 |
                         lookup_pos
                         [(uint)j >> 0xe & 0x3c | (uint)i >> 10 & 0x3c0 |
                          lookup_pos
                          [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                           lookup_pos
                           [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                            lookup_pos
                            [((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] & 3
                           ] & 3] & 3] & 3] & 3] & 3] & 3] >> 2) |
            (ulong)((lookup_pos
                     [((uint)j >> 2 & 0x3c) + (i & 0xf0U) * 4 |
                      lookup_pos
                      [(uint)j >> 6 & 0x3c | (uint)i >> 2 & 0x3c0 |
                       lookup_pos
                       [(uint)j >> 10 & 0x3c | (uint)i >> 6 & 0x3c0 |
                        lookup_pos
                        [(uint)j >> 0xe & 0x3c | (uint)i >> 10 & 0x3c0 |
                         lookup_pos
                         [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                          lookup_pos
                          [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                           lookup_pos
                           [((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] & 3]
                          & 3] & 3] & 3] & 3] & 3] & 0xfffc) << 6) |
            (ulong)((lookup_pos
                     [(uint)j >> 6 & 0x3c | (uint)i >> 2 & 0x3c0 |
                      lookup_pos
                      [(uint)j >> 10 & 0x3c | (uint)i >> 6 & 0x3c0 |
                       lookup_pos
                       [(uint)j >> 0xe & 0x3c | (uint)i >> 10 & 0x3c0 |
                        lookup_pos
                        [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                         lookup_pos
                         [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                          lookup_pos
                          [((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] & 3]
                         & 3] & 3] & 3] & 3] & 0xfffc) << 0xe) |
            (ulong)(lookup_pos
                    [(uint)j >> 10 & 0x3c | (uint)i >> 6 & 0x3c0 |
                     lookup_pos
                     [(uint)j >> 0xe & 0x3c | (uint)i >> 10 & 0x3c0 |
                      lookup_pos
                      [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                       lookup_pos
                       [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                        lookup_pos
                        [((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] & 3] &
                       3] & 3] & 3] & 0xfffffffc) << 0x16 |
            (ulong)(lookup_pos
                    [(uint)j >> 0xe & 0x3c | (uint)i >> 10 & 0x3c0 |
                     lookup_pos
                     [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                      lookup_pos
                      [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                       lookup_pos
                       [((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] & 3] & 3
                     ] & 3] & 0xfffffffc) << 0x1e |
            (ulong)(lookup_pos
                    [(uint)j >> 0x12 & 0x3c | (uint)i >> 0xe & 0x3c0 |
                     lookup_pos
                     [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                      lookup_pos[((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4]
                      & 3] & 3] & 0xfffffffc) << 0x26 |
            (ulong)(lookup_pos
                    [(uint)j >> 0x16 & 0x3c | (uint)i >> 0x12 & 0x3c0 |
                     lookup_pos[((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4]
                     & 3] & 0xfffffffc) << 0x2e |
            (ulong)(lookup_pos[((uint)i >> 0x16 & 0xffffffc0 | face & 1U) + ((uint)j >> 0x1c) * 4] &
                   0x3fc) << 0x36 | (ulong)(uint)face << 0x3c) * 2 + 1);
  }
  uVar4 = std::__throw_system_error(iVar1);
  *plVar2 = 0;
  *puVar3 = 0;
  _Unwind_Resume(uVar4);
}

Assistant:

S2CellId S2CellId::FromFaceIJ(int face, int i, int j) {
  // Initialization if not done yet
  MaybeInit();

  // Optimization notes:
  //  - Non-overlapping bit fields can be combined with either "+" or "|".
  //    Generally "+" seems to produce better code, but not always.

  // Note that this value gets shifted one bit to the left at the end
  // of the function.
  uint64 n = absl::implicit_cast<uint64>(face) << (kPosBits - 1);

  // Alternating faces have opposite Hilbert curve orientations; this
  // is necessary in order for all faces to have a right-handed
  // coordinate system.
  uint64 bits = (face & kSwapMask);

  // Each iteration maps 4 bits of "i" and "j" into 8 bits of the Hilbert
  // curve position.  The lookup table transforms a 10-bit key of the form
  // "iiiijjjjoo" to a 10-bit value of the form "ppppppppoo", where the
  // letters [ijpo] denote bits of "i", "j", Hilbert curve position, and
  // Hilbert curve orientation respectively.
#define GET_BITS(k) do { \
    const int mask = (1 << kLookupBits) - 1; \
    bits += ((i >> (k * kLookupBits)) & mask) << (kLookupBits + 2); \
    bits += ((j >> (k * kLookupBits)) & mask) << 2; \
    bits = lookup_pos[bits]; \
    n |= (bits >> 2) << (k * 2 * kLookupBits); \
    bits &= (kSwapMask | kInvertMask); \
  } while (0)

  GET_BITS(7);
  GET_BITS(6);
  GET_BITS(5);
  GET_BITS(4);
  GET_BITS(3);
  GET_BITS(2);
  GET_BITS(1);
  GET_BITS(0);
#undef GET_BITS

  return S2CellId(n * 2 + 1);
}